

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

ngram_model_t * ps_get_lm(ps_decoder_t *ps,char *name)

{
  int iVar1;
  ps_search_t *ppVar2;
  ps_search_t *search;
  char *name_local;
  ps_decoder_t *ps_local;
  
  ppVar2 = ps_find_search(ps,name);
  if (ppVar2 == (ps_search_t *)0x0) {
    ps_local = (ps_decoder_t *)0x0;
  }
  else {
    iVar1 = strcmp("ngram",ppVar2->type);
    if (iVar1 == 0) {
      ps_local = (ps_decoder_t *)ppVar2[1].vt;
    }
    else {
      ps_local = (ps_decoder_t *)0x0;
    }
  }
  return (ngram_model_t *)ps_local;
}

Assistant:

ngram_model_t *
ps_get_lm(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search =  ps_find_search(ps, name);
    if (search == NULL)
        return NULL;
    if (0 != strcmp(PS_SEARCH_TYPE_NGRAM, ps_search_type(search)))
        return NULL;
    return ((ngram_search_t *) search)->lmset;
}